

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCas<(moira::Instr)143,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  Ea<(moira::Mode)3,_1> dst;
  u32 local_44;
  ushort local_40;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  if (((uVar4 & 0xfe38) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)143,(moira::Mode)3,1>(this,str,addr,op);
    return;
  }
  cVar7 = 'c';
  lVar5 = 1;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar7;
    cVar7 = "cas"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  pcVar6 = str->ptr;
  SVar2 = str->style->syntax;
  str->ptr = pcVar6 + 1;
  if (2 < SVar2 - MOIRA_MIT) {
    *pcVar6 = '.';
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
  }
  *pcVar6 = 'b';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    pcVar6 = str->ptr;
    do {
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
      pcVar6 = str->ptr;
    } while (pcVar6 < str->base + iVar3);
  }
  StrWriter::operator<<(str,(Dn)(uVar4 & 7));
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Dn)((uVar4 & 0xffff) >> 6 & 7));
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_1> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar7 = ';';
    lVar5 = 1;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar7;
      cVar7 = "trap%-2s  ; (2+)"[lVar5 + 10];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmCas(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto dc  = Dn ( _____________xxx(ext) );
    auto du  = Dn ( _______xxx______(ext) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << dc << Sep{} << du << Sep{} << dst;
    str << Av<I, M, S>{};
}